

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O2

shared_ptr<aeron::Subscription> __thiscall
aeron::ClientConductor::findSubscription(ClientConductor *this,int64_t registrationId)

{
  int32_t errorCode;
  long lVar1;
  long lVar2;
  longlong lVar3;
  DriverTimeoutException *this_00;
  char *pcVar4;
  RegistrationException *this_01;
  long lVar5;
  long in_RDX;
  long lVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar7;
  shared_ptr<aeron::Subscription> sVar8;
  allocator local_d2;
  allocator local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::recursive_mutex::lock((recursive_mutex *)&((pthread_mutex_t *)(registrationId + 8))->__data);
  lVar7 = *(long *)(registrationId + 0x60);
  lVar1 = *(long *)(registrationId + 0x68);
  lVar5 = lVar1 - lVar7;
  lVar6 = lVar5 % 0xc0;
  for (lVar2 = lVar5 / 0xc0 >> 2; 0 < lVar2; lVar2 = lVar2 + -1) {
    if (*(long *)(lVar7 + 0x20) == in_RDX) goto LAB_00148f36;
    if (*(long *)(lVar7 + 0xe0) == in_RDX) {
      lVar7 = lVar7 + 0xc0;
      goto LAB_00148f36;
    }
    if (*(long *)(lVar7 + 0x1a0) == in_RDX) {
      lVar7 = lVar7 + 0x180;
      goto LAB_00148f36;
    }
    if (*(long *)(lVar7 + 0x260) == in_RDX) {
      lVar7 = lVar7 + 0x240;
      goto LAB_00148f36;
    }
    lVar7 = lVar7 + 0x300;
    lVar5 = lVar5 + -0x300;
  }
  lVar2 = lVar5 / 0xc0;
  lVar6 = lVar5 % 0xc0;
  if (lVar2 == 1) {
LAB_00148f13:
    if (*(long *)(lVar7 + 0x20) != in_RDX) {
      lVar7 = lVar1;
    }
LAB_00148f36:
    if (lVar7 != lVar1) {
      std::__shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2> *)this,lVar7 + 0x70,
                 lVar6);
      if (*(long *)(lVar7 + 0x60) != 0) {
        std::__shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>::reset
                  ((__shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2> *)(lVar7 + 0x60));
      }
      if ((this->_vptr_ClientConductor == (_func_int **)0x0) && (*(int *)(lVar7 + 0x38) == 0)) {
        lVar3 = std::function<long_long_()>::operator()
                          ((function<long_long_()> *)(registrationId + 0x1d8));
        if (*(long *)(registrationId + 0x210) + *(long *)(lVar7 + 0x30) < lVar3) {
          this_00 = (DriverTimeoutException *)__cxa_allocate_exception(0x48);
          std::__cxx11::to_string(&local_70,*(long *)(registrationId + 0x210));
          std::operator+(&local_d0,"no response from driver in ",&local_70);
          std::operator+(&local_b0,&local_d0," ms");
          std::__cxx11::string::string
                    ((string *)&local_90,
                     "std::shared_ptr<Subscription> aeron::ClientConductor::findSubscription(std::int64_t)"
                     ,&local_d1);
          pcVar4 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                     ,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
                                    );
          std::__cxx11::string::string((string *)&local_50,pcVar4,&local_d2);
          util::DriverTimeoutException::DriverTimeoutException
                    (this_00,&local_b0,&local_90,&local_50,0x10f);
          __cxa_throw(this_00,&util::DriverTimeoutException::typeinfo,
                      util::SourcedException::~SourcedException);
        }
      }
      else if ((this->_vptr_ClientConductor == (_func_int **)0x0) && (*(int *)(lVar7 + 0x38) == 2))
      {
        this_01 = (RegistrationException *)__cxa_allocate_exception(0x50);
        errorCode = *(int32_t *)(lVar7 + 0x3c);
        std::__cxx11::string::string
                  ((string *)&local_b0,
                   "std::shared_ptr<Subscription> aeron::ClientConductor::findSubscription(std::int64_t)"
                   ,(allocator *)&local_70);
        pcVar4 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                   ,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
                                  );
        std::__cxx11::string::string((string *)&local_d0,pcVar4,(allocator *)&local_90);
        util::RegistrationException::RegistrationException
                  (this_01,errorCode,(string *)(lVar7 + 0x40),&local_b0,&local_d0,0x114);
        __cxa_throw(this_01,&util::RegistrationException::typeinfo,
                    util::SourcedException::~SourcedException);
      }
      goto LAB_0014906e;
    }
  }
  else {
    if (lVar2 == 2) {
LAB_00148f06:
      if (*(long *)(lVar7 + 0x20) != in_RDX) {
        lVar7 = lVar7 + 0xc0;
        goto LAB_00148f13;
      }
      goto LAB_00148f36;
    }
    if (lVar2 == 3) {
      if (*(long *)(lVar7 + 0x20) != in_RDX) {
        lVar7 = lVar7 + 0xc0;
        goto LAB_00148f06;
      }
      goto LAB_00148f36;
    }
  }
  this->_vptr_ClientConductor = (_func_int **)0x0;
  (this->m_adminLock).super___recursive_mutex_base._M_mutex.__align = 0;
LAB_0014906e:
  pthread_mutex_unlock((pthread_mutex_t *)(registrationId + 8));
  sVar8.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar8.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<aeron::Subscription>)
         sVar8.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Subscription> ClientConductor::findSubscription(std::int64_t registrationId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto it = std::find_if(m_subscriptions.begin(), m_subscriptions.end(),
        [registrationId](const SubscriptionStateDefn &entry)
        {
            return registrationId == entry.m_registrationId;
        });

    if (it == m_subscriptions.end())
    {
        return std::shared_ptr<Subscription>();
    }

    SubscriptionStateDefn& state = *it;
    std::shared_ptr<Subscription> sub = state.m_subscription.lock();

    // now remove the cached value
    if (state.m_subscriptionCache)
    {
        state.m_subscriptionCache.reset();
    }

    if (!sub && RegistrationStatus::AWAITING_MEDIA_DRIVER == state.m_status)
    {
        if (m_epochClock() > (state.m_timeOfRegistration + m_driverTimeoutMs))
        {
            throw DriverTimeoutException(
                "no response from driver in " +  std::to_string(m_driverTimeoutMs) + " ms", SOURCEINFO);
        }
    }
    else if (!sub && RegistrationStatus::ERRORED_MEDIA_DRIVER == state.m_status)
    {
        throw RegistrationException(state.m_errorCode, state.m_errorMessage, SOURCEINFO);
    }

    return sub;
}